

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestBuildAndTestHandler::cmCTestBuildAndTestHandler(cmCTestBuildAndTestHandler *this)

{
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_00bb8fc0;
  (this->Output)._M_dataplus._M_p = (pointer)&(this->Output).field_2;
  (this->Output)._M_string_length = 0;
  (this->Output).field_2._M_local_buf[0] = '\0';
  (this->BuildGenerator)._M_dataplus._M_p = (pointer)&(this->BuildGenerator).field_2;
  (this->BuildGenerator)._M_string_length = 0;
  (this->BuildGenerator).field_2._M_local_buf[0] = '\0';
  (this->BuildGeneratorPlatform)._M_dataplus._M_p = (pointer)&(this->BuildGeneratorPlatform).field_2
  ;
  (this->BuildGeneratorPlatform)._M_string_length = 0;
  (this->BuildGeneratorPlatform).field_2._M_local_buf[0] = '\0';
  (this->BuildGeneratorToolset)._M_dataplus._M_p = (pointer)&(this->BuildGeneratorToolset).field_2;
  (this->BuildGeneratorToolset)._M_string_length = 0;
  (this->BuildGeneratorToolset).field_2._M_local_buf[0] = '\0';
  (this->BuildOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BuildOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BuildOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BuildMakeProgram)._M_dataplus._M_p = (pointer)&(this->BuildMakeProgram).field_2;
  (this->BuildMakeProgram)._M_string_length = 0;
  (this->BuildMakeProgram).field_2._M_local_buf[0] = '\0';
  (this->ConfigSample)._M_dataplus._M_p = (pointer)&(this->ConfigSample).field_2;
  (this->ConfigSample)._M_string_length = 0;
  (this->ConfigSample).field_2._M_local_buf[0] = '\0';
  (this->SourceDir)._M_dataplus._M_p = (pointer)&(this->SourceDir).field_2;
  (this->SourceDir)._M_string_length = 0;
  (this->SourceDir).field_2._M_local_buf[0] = '\0';
  (this->BinaryDir)._M_dataplus._M_p = (pointer)&(this->BinaryDir).field_2;
  (this->BinaryDir)._M_string_length = 0;
  (this->BinaryDir).field_2._M_local_buf[0] = '\0';
  (this->BuildProject)._M_dataplus._M_p = (pointer)&(this->BuildProject).field_2;
  (this->BuildProject)._M_string_length = 0;
  (this->BuildProject).field_2._M_local_buf[0] = '\0';
  (this->TestCommand)._M_dataplus._M_p = (pointer)&(this->TestCommand).field_2;
  (this->TestCommand)._M_string_length = 0;
  (this->TestCommand).field_2._M_local_buf[0] = '\0';
  (this->BuildRunDir)._M_dataplus._M_p = (pointer)&(this->BuildRunDir).field_2;
  (this->BuildRunDir)._M_string_length = 0;
  (this->BuildRunDir).field_2._M_local_buf[0] = '\0';
  (this->ExecutableDirectory)._M_dataplus._M_p = (pointer)&(this->ExecutableDirectory).field_2;
  (this->ExecutableDirectory)._M_string_length = 0;
  (this->ExecutableDirectory).field_2._M_local_buf[0] = '\0';
  this->BuildTwoConfig = false;
  this->BuildNoClean = false;
  (this->Timeout).__r = 0.0;
  (this->TestCommandArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TestCommandArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TestCommandArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BuildTargets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BuildTargets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BuildTargets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->BuildNoCMake = false;
  return;
}

Assistant:

cmCTestBuildAndTestHandler::cmCTestBuildAndTestHandler()
{
  this->BuildTwoConfig = false;
  this->BuildNoClean = false;
  this->BuildNoCMake = false;
  this->Timeout = cmDuration::zero();
}